

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O0

void __thiscall KVStore::~KVStore(KVStore *this)

{
  int __val;
  bool bVar1;
  unsigned_long uVar2;
  char *__path;
  SSTableCache *pSVar3;
  reference ppVar4;
  uint uVar5;
  __mode_t __mode;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>
  *c;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
  *__range1;
  string local_f8 [32];
  SSTableCache *local_d8;
  __cxx11 local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [40];
  KVStore *this_local;
  uint64_t uVar6;
  string *__rhs;
  
  (this->super_KVStoreAPI)._vptr_KVStoreAPI = (_func_int **)&PTR_put_00127d10;
  local_30._32_8_ = this;
  uVar2 = SkipList::getLength(&this->memTable);
  if (uVar2 != 0) {
    std::operator+(local_30,(char *)&this->storagePath);
    bVar1 = utils::dirExists(local_30);
    std::__cxx11::string::~string((string *)local_30);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      __rhs = &this->storagePath;
      std::operator+(local_50,(char *)__rhs);
      __mode = (__mode_t)__rhs;
      __path = (char *)std::__cxx11::string::c_str();
      utils::mkdir(__path,__mode);
      std::__cxx11::string::~string((string *)local_50);
    }
    std::operator+(local_b0,(char *)&this->storagePath);
    __val = this->fileNums;
    uVar5 = __val + 1;
    uVar6 = (uint64_t)uVar5;
    this->fileNums = uVar5;
    std::__cxx11::to_string(local_d0,__val);
    std::operator+(local_90,local_b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   (char *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_b0);
    SSTable::toSSTable((SSTable *)&this->memTable,(SkipList *)local_70,(string *)this->timeStamp,
                       uVar6);
    pSVar3 = (SSTableCache *)operator_new(0x2858);
    uVar6 = this->timeStamp;
    std::__cxx11::string::string(local_f8,(string *)local_70);
    SSTableCache::SSTableCache(pSVar3,&this->memTable,uVar6,(string *)local_f8);
    local_d8 = pSVar3;
    std::
    map<std::__cxx11::string,SSTableCache*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
    ::emplace<std::__cxx11::string&,SSTableCache*>
              ((map<std::__cxx11::string,SSTableCache*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SSTableCache*>>>
                *)&this->cache,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               &local_d8);
    std::__cxx11::string::~string(local_f8);
    compaction(this,0);
    std::__cxx11::string::~string((string *)local_70);
  }
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
           ::begin(&this->cache);
  c = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
         ::end(&this->cache);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&c), bVar1) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>
             ::operator*(&__end1);
    pSVar3 = ppVar4->second;
    if (pSVar3 != (SSTableCache *)0x0) {
      SSTableCache::~SSTableCache(pSVar3);
      operator_delete(pSVar3,0x2858);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>
    ::operator++(&__end1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SSTableCache_*>_>_>
  ::~map(&this->cache);
  SkipList::~SkipList(&this->memTable);
  std::__cxx11::string::~string((string *)&this->storagePath);
  return;
}

Assistant:

KVStore::~KVStore() {
  if (memTable.getLength() > 0) {
    if (!utils::dirExists(storagePath + "/level-0"))
      utils::mkdir((storagePath + "/level-0").c_str());
    auto fileName = storagePath + "/level-0/" + to_string(fileNums++) + ".sst";
    SSTable::toSSTable(memTable, fileName, timeStamp);
    cache.emplace(fileName, new SSTableCache(memTable, timeStamp, fileName));
    compaction(0);
  }

  for (auto &c : cache) delete c.second;
}